

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (ulong)X->n;
  if (uVar4 != 0) {
    do {
      if (X->p[uVar4 - 1] != 0) goto LAB_00218358;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
  }
LAB_00218358:
  uVar3 = (ulong)Y->n;
  if (uVar3 != 0) {
    do {
      if (Y->p[uVar3 - 1] != 0) goto LAB_00218373;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar3 = 0;
  }
LAB_00218373:
  if (uVar3 == 0 && uVar4 == 0) {
LAB_002183ca:
    iVar2 = 0;
  }
  else if (uVar3 < uVar4) {
    iVar2 = (int)X->s;
  }
  else if (uVar4 < uVar3) {
    iVar2 = -(int)Y->s;
  }
  else {
    sVar1 = X->s;
    if ((sVar1 < 1) || (-1 < Y->s)) {
      if ((-1 < sVar1) || (iVar2 = -1, Y->s < 1)) {
        do {
          bVar5 = uVar4 == 0;
          uVar4 = uVar4 - 1;
          if (bVar5) goto LAB_002183ca;
          if (Y->p[uVar4] < X->p[uVar4]) {
            return (int)sVar1;
          }
        } while (Y->p[uVar4] <= X->p[uVar4]);
        iVar2 = -(int)sVar1;
      }
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_cmp_mpi(const mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    size_t i, j;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    for (i = X->n; i > 0; i--) {
        if (X->p[i - 1] != 0) {
            break;
        }
    }

    for (j = Y->n; j > 0; j--) {
        if (Y->p[j - 1] != 0) {
            break;
        }
    }

    if (i == 0 && j == 0) {
        return 0;
    }

    if (i > j) {
        return X->s;
    }
    if (j > i) {
        return -Y->s;
    }

    if (X->s > 0 && Y->s < 0) {
        return 1;
    }
    if (Y->s > 0 && X->s < 0) {
        return -1;
    }

    for (; i > 0; i--) {
        if (X->p[i - 1] > Y->p[i - 1]) {
            return X->s;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
            return -X->s;
        }
    }

    return 0;
}